

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

void __thiscall
QPixmapBlurFilter::draw
          (QPixmapBlurFilter *this,QPainter *painter,QPointF *p,QPixmap *src,QRectF *rect)

{
  bool bVar1;
  Int IVar2;
  QPixmapBlurFilterPrivate *pQVar3;
  ulong uVar4;
  QTransform *pQVar5;
  void *__src;
  QPointF *in_RCX;
  QRectF *in_RDX;
  QPainter *in_RSI;
  qreal *in_R8;
  long in_FS_OFFSET;
  QFlags<QGraphicsBlurEffect::BlurHint> *this_00;
  qreal scaledRadius;
  QPixmapBlurFilterPrivate *d;
  QRect rect_1;
  QImage srcImage;
  qreal scale;
  QRectF srcRect;
  QTransform transform;
  QRect *in_stack_fffffffffffffe38;
  QPainter *pQVar6;
  QRectF *in_stack_fffffffffffffe40;
  QRect *in_stack_fffffffffffffe48;
  QRectF *in_stack_fffffffffffffe50;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> local_174;
  QPixmap local_170 [24];
  QImage local_158 [24];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  QImage local_110 [24];
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  double local_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  qreal local_98;
  qreal local_90;
  qreal local_88;
  qreal local_80;
  QRectF local_78;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QPixmapBlurFilter *)0x4ac7ef);
  uVar4 = QPainter::isActive();
  if ((uVar4 & 1) != 0) {
    uVar4 = QPixmap::isNull();
    if ((uVar4 & 1) == 0) {
      local_78.xp = *in_R8;
      local_78.yp = in_R8[1];
      local_78.w = in_R8[2];
      local_78.h = in_R8[3];
      bVar1 = QRectF::isNull(&local_78);
      if (bVar1) {
        local_a8 = QPixmap::rect();
        QRectF::QRectF(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        local_78.xp = local_98;
        local_78.yp = local_90;
        local_78.w = local_88;
        local_78.h = local_80;
      }
      if (1.0 < pQVar3->radius) {
        this_00 = (QFlags<QGraphicsBlurEffect::BlurHint> *)(pQVar3->radius * 2.5);
        local_d0 = -NAN;
        pQVar5 = (QTransform *)QPainter::transform();
        uVar4 = qt_scaleForTransform(pQVar5,&local_d0);
        if ((uVar4 & 1) != 0) {
          this_00 = (QFlags<QGraphicsBlurEffect::BlurHint> *)((double)this_00 / local_d0);
        }
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        QImage::QImage((QImage *)&local_e8);
        local_f8 = QPixmap::rect();
        bVar1 = ::operator==(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        if (bVar1) {
          QPixmap::toImage();
          QImage::operator=((QImage *)in_stack_fffffffffffffe48,(QImage *)in_stack_fffffffffffffe40)
          ;
          QImage::~QImage(local_110);
        }
        else {
          local_120._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_120._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_130 = QRectF::toAlignedRect();
          local_140 = QPixmap::rect();
          local_120 = (undefined1  [16])
                      QRect::intersected((QRect *)in_stack_fffffffffffffe40,
                                         in_stack_fffffffffffffe38);
          QPixmap::copy((QRect *)local_170);
          QPixmap::toImage();
          QImage::operator=((QImage *)in_stack_fffffffffffffe48,(QImage *)in_stack_fffffffffffffe40)
          ;
          QImage::~QImage(local_158);
          QPixmap::~QPixmap(local_170);
        }
        memcpy(local_58,&DAT_00b0e7d0,0x50);
        __src = (void *)QPainter::worldTransform();
        memcpy(local_58,__src,0x50);
        QPainter::translate((QPointF *)in_RSI);
        pQVar6 = in_RSI;
        local_174.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i =
             (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
             QFlags<QGraphicsBlurEffect::BlurHint>::operator&
                       (this_00,(BlurHint)((ulong)in_RSI >> 0x20));
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_174);
        qt_blurImage(pQVar6,(QImage *)&local_e8,(double)this_00,IVar2 != 0,false,0);
        QPainter::setWorldTransform((QTransform *)in_RSI,SUB81(local_58,0));
        QImage::~QImage((QImage *)&local_e8);
      }
      else {
        QRectF::translated(in_RDX,in_RCX);
        QPainter::drawPixmap((QRectF *)in_RSI,(QPixmap *)local_c8,(QRectF *)in_RCX);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapBlurFilter::draw(QPainter *painter, const QPointF &p, const QPixmap &src, const QRectF &rect) const
{
    Q_D(const QPixmapBlurFilter);
    if (!painter->isActive())
        return;

    if (src.isNull())
        return;

    QRectF srcRect = rect;
    if (srcRect.isNull())
        srcRect = src.rect();

    if (d->radius <= 1) {
        painter->drawPixmap(srcRect.translated(p), src, srcRect);
        return;
    }

    qreal scaledRadius = radiusScale * d->radius;
    qreal scale;
    if (qt_scaleForTransform(painter->transform(), &scale))
        scaledRadius /= scale;

    QImage srcImage;

    if (srcRect == src.rect()) {
        srcImage = src.toImage();
    } else {
        QRect rect = srcRect.toAlignedRect().intersected(src.rect());
        srcImage = src.copy(rect).toImage();
    }

    QTransform transform = painter->worldTransform();
    painter->translate(p);
    qt_blurImage(painter, srcImage, scaledRadius, (d->hints & QGraphicsBlurEffect::QualityHint), false);
    painter->setWorldTransform(transform);
}